

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts5IterSetOutputs_Nocolset(Fts5Iter *pIter,Fts5SegIter *pSeg)

{
  Fts5Buffer *in_RSI;
  Fts5Colset *in_RDI;
  Fts5SegIter *unaff_retaddr;
  
  *in_RDI = (Fts5Colset)in_RSI[7].p;
  in_RDI[2].nCol = in_RSI[7].n;
  if ((long)*(int *)(in_RSI[1].p + 0xc) < (long)(in_RSI[2].p + in_RSI[7].n)) {
    sqlite3Fts5BufferZero((Fts5Buffer *)(in_RDI + 5));
    fts5SegiterPoslist((Fts5Index *)pSeg,unaff_retaddr,in_RDI,in_RSI);
    in_RDI[1] = in_RDI[5];
  }
  else {
    in_RDI[1] = (Fts5Colset)(*(long *)in_RSI[1].p + (long)in_RSI[2].p);
  }
  return;
}

Assistant:

static void fts5IterSetOutputs_Nocolset(Fts5Iter *pIter, Fts5SegIter *pSeg){
  pIter->base.iRowid = pSeg->iRowid;
  pIter->base.nData = pSeg->nPos;

  assert( pIter->pIndex->pConfig->eDetail!=FTS5_DETAIL_NONE );
  assert( pIter->pColset==0 );

  if( pSeg->iLeafOffset+pSeg->nPos<=pSeg->pLeaf->szLeaf ){
    /* All data is stored on the current page. Populate the output
    ** variables to point into the body of the page object. */
    pIter->base.pData = &pSeg->pLeaf->p[pSeg->iLeafOffset];
  }else{
    /* The data is distributed over two or more pages. Copy it into the
    ** Fts5Iter.poslist buffer and then set the output pointer to point
    ** to this buffer.  */
    fts5BufferZero(&pIter->poslist);
    fts5SegiterPoslist(pIter->pIndex, pSeg, 0, &pIter->poslist);
    pIter->base.pData = pIter->poslist.p;
  }
}